

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomization_functions.c
# Opt level: O2

int16_t WebRtcSpl_RandUArray(int16_t *vector,int16_t vector_length,uint32_t *seed)

{
  long lVar1;
  int iVar2;
  undefined6 in_register_00000032;
  uint uVar3;
  
  lVar1 = 0;
  iVar2 = (int)CONCAT62(in_register_00000032,vector_length);
  if (vector_length < 1) {
    iVar2 = 0;
  }
  for (; iVar2 != lVar1; lVar1 = lVar1 + 1) {
    uVar3 = *seed * 0x10dcd + 1 & 0x7fffffff;
    *seed = uVar3;
    vector[lVar1] = (int16_t)(uVar3 >> 0x10);
  }
  return vector_length;
}

Assistant:

int16_t WebRtcSpl_RandUArray(int16_t* vector,
                             int16_t vector_length,
                             uint32_t* seed) {
  int i;
  for (i = 0; i < vector_length; i++) {
    vector[i] = WebRtcSpl_RandU(seed);
  }
  return vector_length;
}